

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O1

char * flatcc_json_parser_match_constant
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int pos,int *more)

{
  byte *buf_00;
  byte bVar1;
  long lVar2;
  byte *pbVar3;
  byte *buf_01;
  
  lVar2 = (long)pos;
  if ((long)end - (long)buf <= lVar2) {
LAB_00123d95:
    *more = 0;
    return buf;
  }
  buf_00 = (byte *)(buf + lVar2);
  pbVar3 = buf_00;
  if (ctx->unquoted == 0) {
    if (*buf_00 == 0x20) {
      buf_01 = (byte *)(buf + ((long)end - (long)buf));
      pbVar3 = (byte *)(buf + lVar2);
      do {
        pbVar3 = pbVar3 + 1;
        if (pbVar3 == (byte *)end) goto LAB_00123de1;
      } while (*pbVar3 == 0x20);
      buf_01 = pbVar3;
      if (pbVar3 == (byte *)end) goto LAB_00123de1;
      if (*pbVar3 != 0x22) goto LAB_00123da0;
    }
    if (*pbVar3 != 0x22) {
      if (*pbVar3 == 0x5c) {
        *more = 0;
        if (ctx->error != 0) {
          return end;
        }
        ctx->error = 0x12;
        ctx->pos = ((int)pbVar3 - *(int *)&ctx->line_start) + 1;
        ctx->error_loc = (char *)pbVar3;
        return end;
      }
      goto LAB_00123d95;
    }
    buf_01 = pbVar3 + 1;
    if (1 < (long)end - (long)buf_01) {
      if (' ' < (char)*buf_01) goto LAB_00123de1;
      if ((*buf_01 == 0x20) && (' ' < (char)pbVar3[2])) {
        buf_01 = pbVar3 + 2;
        goto LAB_00123de1;
      }
    }
    buf_01 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)buf_01,end);
    goto LAB_00123de1;
  }
  if ((long)end - (long)buf_00 < 2) {
LAB_00123cc5:
    pbVar3 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)buf_00,end);
  }
  else if ((char)*buf_00 < '!') {
    if ((*buf_00 != 0x20) || ((char)buf_00[1] < '!')) goto LAB_00123cc5;
    pbVar3 = buf_00 + 1;
  }
  buf_01 = pbVar3;
  if (pbVar3 != (byte *)end) {
    if ((pbVar3 == buf_00) ||
       ((bVar1 = *pbVar3, bVar1 != 0x5f && -1 < (char)bVar1 &&
        (0x19 < (byte)((bVar1 | 0x20) + 0x9f))))) {
      *more = 0;
      bVar1 = *pbVar3;
      if (bVar1 == 0x2c) {
        return (char *)pbVar3;
      }
      if (bVar1 != 0x5d) {
        if (bVar1 != 0x7d) {
          return buf;
        }
        return (char *)pbVar3;
      }
      return (char *)pbVar3;
    }
LAB_00123da0:
    *more = 1;
    return (char *)pbVar3;
  }
LAB_00123de1:
  *more = 0;
  return (char *)buf_01;
}

Assistant:

const char *flatcc_json_parser_match_constant(flatcc_json_parser_t *ctx, const char *buf, const char *end, int pos, int *more)
{
    const char *mark = buf, *k = buf + pos;

    if (end - buf <= pos) {
        *more = 0;
        return buf;
    }
#if FLATCC_JSON_PARSE_ALLOW_UNQUOTED
    if (ctx->unquoted) {
        buf = flatcc_json_parser_space(ctx, k, end);
        if (buf == end) {
            /*
             * We cannot make a decision on more.
             * Just return end and let parser handle sync point in
             * case it is able to resume parse later on.
             * For the same reason we do not lower ctx->unquoted.
             */
            *more = 0;
            return buf;
        }
        if (buf != k) {
            char c = *buf;
            /*
             * Space was seen - and thus we have a valid match.
             * If the next char is an identifier start symbol
             * we raise the more flag to support syntax like:
             *
             *     `flags: Hungry Sleepy Awake, ...`
             */
            if (c == '_' || (c & 0x80)) {
                *more = 1;
                return buf;
            }
            c |= 0x20;
            if (c >= 'a' && c <= 'z') {
                *more = 1;
                return buf;
            }
        }
        /*
         * Space was not seen, so the match is only valid if followed
         * by a JSON separator symbol, and there cannot be more values
         * following so `more` is lowered.
         */
        *more = 0;
        if (*buf == ',' || *buf == '}' || *buf == ']') {
            return buf;
        }
        return mark;
    }
#endif
    buf = k;
    if (*buf == 0x20) {
        ++buf;
        while (buf != end && *buf == 0x20) {
            ++buf;
        }
        if (buf == end) {
            *more = 0;
            return buf;
        }
        /* We accept untrimmed space like "  Green  Blue  ". */
        if (*buf != '\"') {
            *more = 1;
            return buf;
        }
    }
    switch (*buf) {
    case '\\':
        *more = 0;
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_invalid_escape);
    case '\"':
        buf = flatcc_json_parser_space(ctx, buf + 1, end);
        *more = 0;
        return buf;
    }
    *more = 0;
    return mark;
}